

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O1

ostream * OpenMD::operator<<(ostream *os,OpenMDBitSet *bs)

{
  long lVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  bool bVar8;
  string val;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  lVar1 = (long)(bs->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  if (((long)(bs->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - lVar1) * 8 +
      (ulong)(bs->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset != 0) {
    lVar7 = 0;
    uVar5 = 0;
    do {
      uVar3 = lVar7 >> 0x20;
      uVar4 = uVar3 + 0x3f;
      if (-1 < (long)uVar3) {
        uVar4 = uVar3;
      }
      bVar8 = (*(ulong *)(lVar1 + ((long)uVar4 >> 6) * 8 + -8 +
                         (ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar5 & 0x3f) & 1) != 0;
      pcVar6 = "true";
      if (!bVar8) {
        pcVar6 = "false";
      }
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,pcVar6,pcVar6 + (5 - (ulong)bVar8));
      std::__ostream_insert<char,std::char_traits<char>>(os,"OpenMDBitSet[",0xd);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] = ",4);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_50,local_48);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      uVar5 = uVar5 + 1;
      lVar1 = (long)(bs->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      lVar7 = lVar7 + 0x100000000;
    } while (uVar5 < (ulong)(bs->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                     ((long)(bs->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - lVar1
                     ) * 8);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const OpenMDBitSet& bs) {
    for (size_t i = 0; i < bs.bitset_.size(); ++i) {
      std::string val = bs[i] ? "true" : "false";
      os << "OpenMDBitSet[" << i << "] = " << val << std::endl;
    }

    return os;
  }